

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void LoadFormats(SstStream Stream,FFSFormatList Formats)

{
  void *__dest;
  void *__dest_00;
  undefined8 uVar1;
  undefined8 *in_RSI;
  long in_RDI;
  char *FormatServerRep;
  char *FormatID;
  FFSFormatList Entry;
  undefined8 *local_18;
  
  for (local_18 = in_RSI; local_18 != (undefined8 *)0x0; local_18 = (undefined8 *)local_18[4]) {
    __dest = malloc(local_18[3]);
    __dest_00 = malloc(local_18[1]);
    memcpy(__dest,(void *)local_18[2],local_18[3]);
    memcpy(__dest_00,(void *)*local_18,local_18[1]);
    uVar1 = FMContext_from_FFS(*(undefined8 *)(in_RDI + 0x2c8));
    load_external_format_FMcontext(uVar1,__dest,local_18[3] & 0xffffffff,__dest_00);
    free(__dest);
  }
  return;
}

Assistant:

static void LoadFormats(SstStream Stream, FFSFormatList Formats)
{
    FFSFormatList Entry = Formats;
    while (Entry)
    {
        char *FormatID = malloc(Entry->FormatIDRepLen);
        char *FormatServerRep = malloc(Entry->FormatServerRepLen);
        memcpy(FormatID, Entry->FormatIDRep, Entry->FormatIDRepLen);
        memcpy(FormatServerRep, Entry->FormatServerRep, Entry->FormatServerRepLen);
        load_external_format_FMcontext(FMContext_from_FFS(Stream->ReaderFFSContext), FormatID,
                                       (int)Entry->FormatIDRepLen, FormatServerRep);
        free(FormatID);
        Entry = Entry->Next;
    }
}